

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O1

int noargs(void)

{
  program_t *value;
  value_t *val;
  vm_t vm;
  stack_t sStack_78;
  
  deci::vm_t::vm_t((vm_t *)&sStack_78);
  value = deci::program_t::Create(commands,10);
  val = deci::vm_t::Run((vm_t *)&sStack_78,(value_t *)value);
  deci::stack_t::Push(&sStack_78,val);
  deci::stack_t::Print(&sStack_78,(ostream *)&std::cout);
  (*val->_vptr_value_t[3])(val);
  (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
  deci::vm_t::~vm_t((vm_t *)&sStack_78);
  return 0;
}

Assistant:

int noargs() {
  deci::value_t* tmp;
  deci::vm_t vm;
  deci::program_t* prog = deci::program_t::Create(commands, deci::countof(commands));

  vm.GlobalStack().Push(*(tmp = vm.Run(*prog)));
  vm.GlobalStack().Print(std::cout);

  tmp->Delete();
  prog->Delete();
  return 0;
}